

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

int portStr(void *userData,char *portStr,size_t portStrLen)

{
  bool bVar1;
  uint uVar2;
  IResultCapture *pIVar3;
  ExpressionResultBuilder *pEVar4;
  undefined8 uVar5;
  undefined1 local_6a8 [7];
  bool this_is_here_to_invoke_warnings_1;
  uint local_480;
  allocator<char> local_479;
  Value internal_catch_action_1;
  allocator<char> local_451;
  string local_450;
  SourceLineInfo local_430;
  allocator<char> local_401;
  string local_400;
  undefined1 local_3e0 [8];
  AssertionInfo __assertionInfo155;
  undefined1 local_368 [7];
  bool this_is_here_to_invoke_warnings;
  uint local_140;
  allocator<char> local_139;
  Value internal_catch_action;
  allocator<char> local_111;
  string local_110;
  SourceLineInfo local_f0;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  AssertionInfo __assertionInfo154;
  size_t portStrLen_local;
  char *portStr_local;
  void *userData_local;
  
  __assertionInfo154._104_8_ = portStrLen;
  portStrLen_local = (size_t)portStr;
  portStr_local = (char *)userData;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"CAPTURE",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,&local_111);
    Catch::SourceLineInfo::SourceLineInfo(&local_f0,&local_110,0x9a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&internal_catch_action,"",&local_139);
    Catch::AssertionInfo::AssertionInfo
              ((AssertionInfo *)local_90,&local_b0,&local_f0,(string *)&internal_catch_action,
               ContinueOnFailure);
    std::__cxx11::string::~string((string *)&internal_catch_action);
    std::allocator<char>::~allocator(&local_139);
    Catch::SourceLineInfo::~SourceLineInfo(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    pIVar3 = Catch::getResultCapture();
    Catch::ExpressionResultBuilder::ExpressionResultBuilder
              ((ExpressionResultBuilder *)local_368,Info);
    pEVar4 = Catch::ExpressionResultBuilder::operator<<
                       ((ExpressionResultBuilder *)local_368,(char (*) [12])"portStr := ");
    pEVar4 = Catch::ExpressionResultBuilder::operator<<(pEVar4,(char **)&portStrLen_local);
    uVar2 = (*pIVar3->_vptr_IResultCapture[8])(pIVar3,pEVar4,local_90);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder((ExpressionResultBuilder *)local_368);
    local_140 = uVar2;
    if (uVar2 != 0) {
      if ((uVar2 & 2) != 0) {
        BreakIntoDebugger();
      }
      if ((local_140 & 4) != 0) {
        uVar5 = __cxa_allocate_exception(1);
        __cxa_throw(uVar5,&Catch::TestFailureException::typeinfo,0);
      }
      bVar1 = Catch::shouldContinueOnFailure(1);
      if (!bVar1) {
        uVar5 = __cxa_allocate_exception(1);
        __cxa_throw(uVar5,&Catch::TestFailureException::typeinfo,0);
      }
      bVar1 = Catch::isTrue(false);
      if (bVar1) {
        __assertionInfo155._111_1_ = 1;
        Catch::isTrue(true);
      }
    }
    Catch::AssertionInfo::~AssertionInfo((AssertionInfo *)local_90);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"CAPTURE",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,&local_451);
    Catch::SourceLineInfo::SourceLineInfo(&local_430,&local_450,0x9b);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&internal_catch_action_1,"",&local_479);
    Catch::AssertionInfo::AssertionInfo
              ((AssertionInfo *)local_3e0,&local_400,&local_430,(string *)&internal_catch_action_1,
               ContinueOnFailure);
    std::__cxx11::string::~string((string *)&internal_catch_action_1);
    std::allocator<char>::~allocator(&local_479);
    Catch::SourceLineInfo::~SourceLineInfo(&local_430);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    pIVar3 = Catch::getResultCapture();
    Catch::ExpressionResultBuilder::ExpressionResultBuilder
              ((ExpressionResultBuilder *)local_6a8,Info);
    pEVar4 = Catch::ExpressionResultBuilder::operator<<
                       ((ExpressionResultBuilder *)local_6a8,(char (*) [15])"portStrLen := ");
    pEVar4 = Catch::ExpressionResultBuilder::operator<<
                       (pEVar4,(unsigned_long *)&__assertionInfo154.resultDisposition);
    uVar2 = (*pIVar3->_vptr_IResultCapture[8])(pIVar3,pEVar4,local_3e0);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder((ExpressionResultBuilder *)local_6a8);
    local_480 = uVar2;
    if (uVar2 != 0) {
      if ((uVar2 & 2) != 0) {
        BreakIntoDebugger();
      }
      if ((local_480 & 4) != 0) {
        uVar5 = __cxa_allocate_exception(1);
        __cxa_throw(uVar5,&Catch::TestFailureException::typeinfo,0);
      }
      bVar1 = Catch::shouldContinueOnFailure(1);
      if (!bVar1) {
        uVar5 = __cxa_allocate_exception(1);
        __cxa_throw(uVar5,&Catch::TestFailureException::typeinfo,0);
      }
      bVar1 = Catch::isTrue(false);
      if (bVar1) {
        Catch::isTrue(true);
      }
    }
    Catch::AssertionInfo::~AssertionInfo((AssertionInfo *)local_3e0);
    bVar1 = Catch::isTrue(false);
    if (!bVar1) {
      std::__cxx11::string::assign(portStr_local + 0x70,portStrLen_local);
      return 1;
    }
  } while( true );
}

Assistant:

inline int portStr(void* userData, const char* portStr, size_t portStrLen)
{
    CAPTURE(portStr);
    CAPTURE(portStrLen);
    static_cast<URI*>(userData)->portStr.assign(portStr,portStrLen);
    return 1;
}